

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,ModuleDeclarationSyntax *syntax)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  undefined4 uVar4;
  group_type_pointer pgVar5;
  pointer puVar6;
  size_type sVar7;
  group_type_pointer pgVar8;
  value_type_pointer pbVar9;
  undefined1 auVar10 [16];
  size_t __n;
  int iVar11;
  size_t sVar12;
  SyntaxNode *pSVar13;
  size_t sVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong hash;
  long lVar20;
  ulong uVar21;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *arrays_;
  value_type_pointer ppVar22;
  pointer puVar23;
  bool bVar24;
  uchar uVar25;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  Token token;
  try_emplace_args_t local_d9;
  _Storage<slang::TimeScale,_true> local_d8;
  bool local_d4;
  ulong local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_b0;
  pointer local_a8;
  uint64_t local_a0;
  string_view name;
  locator res;
  
  pSVar13 = (syntax->super_MemberSyntax).super_SyntaxNode.parent;
  if ((pSVar13 != (SyntaxNode *)0x0) && (pSVar13->kind != CompilationUnit)) {
    name = Token::valueText(&((syntax->header).ptr)->name);
    puVar6 = (this->moduleDeclStack).
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .data_;
    sVar7 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    puVar23 = puVar6 + sVar7;
    arrays_ = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (puVar6 + (sVar7 - 1));
    local_a0 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (arrays_,&name);
    uVar15 = local_a0 >> ((byte)*arrays_ & 0x3f);
    pgVar8 = puVar6[sVar7 - 1].table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_;
    lVar20 = (local_a0 & 0xff) * 4;
    uVar25 = (&UNK_0051605c)[lVar20];
    uVar27 = (&UNK_0051605d)[lVar20];
    uVar28 = (&UNK_0051605e)[lVar20];
    uVar29 = (&UNK_0051605f)[lVar20];
    __n = name._M_len;
    local_c8 = name._M_str;
    uVar17 = (uint)local_a0;
    local_b8 = 0;
    uVar19 = uVar15;
    uVar21 = uVar15;
    do {
      pgVar3 = pgVar8 + uVar19;
      auVar26[0] = -(pgVar3->m[0].n == uVar25);
      auVar26[1] = -(pgVar3->m[1].n == uVar27);
      auVar26[2] = -(pgVar3->m[2].n == uVar28);
      auVar26[3] = -(pgVar3->m[3].n == uVar29);
      auVar26[4] = -(pgVar3->m[4].n == uVar25);
      auVar26[5] = -(pgVar3->m[5].n == uVar27);
      auVar26[6] = -(pgVar3->m[6].n == uVar28);
      auVar26[7] = -(pgVar3->m[7].n == uVar29);
      auVar26[8] = -(pgVar3->m[8].n == uVar25);
      auVar26[9] = -(pgVar3->m[9].n == uVar27);
      auVar26[10] = -(pgVar3->m[10].n == uVar28);
      auVar26[0xb] = -(pgVar3->m[0xb].n == uVar29);
      auVar26[0xc] = -(pgVar3->m[0xc].n == uVar25);
      auVar26[0xd] = -(pgVar3->m[0xd].n == uVar27);
      auVar26[0xe] = -(pgVar3->m[0xe].n == uVar28);
      auVar26[0xf] = -(pgVar3->m[0xf].n == uVar29);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
      if (uVar16 != 0) {
        pbVar9 = puVar23[-1].table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_b0 = arrays_;
        local_a8 = puVar23;
        do {
          iVar11 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
            }
          }
          bVar24 = __n == *(size_t *)
                           ((long)&pbVar9[uVar19 * 0xf]._M_len + (ulong)(uint)(iVar11 << 4));
          lVar20 = (long)&pbVar9[uVar19 * 0xf]._M_len + (ulong)(uint)(iVar11 << 4);
          if (bVar24 && __n != 0) {
            local_d0 = uVar21;
            iVar11 = bcmp(local_c8,*(void **)(lVar20 + 8),__n);
            bVar24 = iVar11 == 0;
            uVar21 = local_d0;
          }
          arrays_ = local_b0;
          puVar23 = local_a8;
          if (bVar24) goto LAB_001533d3;
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
      }
      if ((pgVar8[uVar19].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar17 & 7]) == 0) break;
      uVar18 = puVar23[-1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      lVar20 = uVar19 + local_b8;
      local_b8 = local_b8 + 1;
      uVar19 = lVar20 + 1U & uVar18;
    } while (local_b8 <= uVar18);
    lVar20 = 0;
LAB_001533d3:
    if (lVar20 == 0) {
      if (puVar23[-1].table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.size <
          puVar23[-1].table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                         *)arrays_,(arrays_type *)arrays_,uVar15,local_a0,&name);
        psVar1 = &puVar23[-1].table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                  (&res,(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                         *)arrays_,local_a0,&name);
      }
    }
  }
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::emplace_back<>(&(this->moduleDeclStack).
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  );
  sVar12 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar12 != 0) {
    uVar17 = 1;
    sVar12 = 0;
    do {
      pSVar13 = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar12);
      if (pSVar13 == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar12);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (pSVar13,this);
      }
      sVar12 = (size_t)uVar17;
      sVar14 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar17 = uVar17 + 1;
    } while (sVar12 < sVar14);
  }
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::pop_back(&(this->moduleDeclStack).
              super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            );
  local_c8 = *(char **)&this->defaultNetType;
  local_d0 = CONCAT71(local_d0._1_7_,this->cellDefine);
  local_d4 = (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_d8 = (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_payload;
  name._M_len = (size_t)syntax;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = syntax;
  hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar15 = hash >> ((byte)(this->meta).nodeMap.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                          .arrays.groups_size_index & 0x3f);
  pgVar5 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.groups_;
  uVar4 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar22 = (this->meta).nodeMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
            .arrays.elements_;
  uVar19 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.groups_size_mask;
  uVar18 = 0;
  uVar21 = uVar15;
  do {
    pgVar2 = pgVar5 + uVar21;
    uVar25 = (uchar)uVar4;
    auVar30[0] = -(pgVar2->m[0].n == uVar25);
    uVar27 = (uchar)((uint)uVar4 >> 8);
    auVar30[1] = -(pgVar2->m[1].n == uVar27);
    uVar28 = (uchar)((uint)uVar4 >> 0x10);
    auVar30[2] = -(pgVar2->m[2].n == uVar28);
    uVar29 = (uchar)((uint)uVar4 >> 0x18);
    auVar30[3] = -(pgVar2->m[3].n == uVar29);
    auVar30[4] = -(pgVar2->m[4].n == uVar25);
    auVar30[5] = -(pgVar2->m[5].n == uVar27);
    auVar30[6] = -(pgVar2->m[6].n == uVar28);
    auVar30[7] = -(pgVar2->m[7].n == uVar29);
    auVar30[8] = -(pgVar2->m[8].n == uVar25);
    auVar30[9] = -(pgVar2->m[9].n == uVar27);
    auVar30[10] = -(pgVar2->m[10].n == uVar28);
    auVar30[0xb] = -(pgVar2->m[0xb].n == uVar29);
    auVar30[0xc] = -(pgVar2->m[0xc].n == uVar25);
    auVar30[0xd] = -(pgVar2->m[0xd].n == uVar27);
    auVar30[0xe] = -(pgVar2->m[0xe].n == uVar28);
    auVar30[0xf] = -(pgVar2->m[0xf].n == uVar29);
    for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe); uVar17 != 0;
        uVar17 = uVar17 - 1 & uVar17) {
      uVar16 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar22[uVar21 * 0xf + (ulong)uVar16].first == syntax) {
        ppVar22 = ppVar22 + uVar21 * 0xf + (ulong)uVar16;
        goto LAB_00153179;
      }
    }
    if ((pgVar5[uVar21].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar20 = uVar21 + uVar18;
    uVar18 = uVar18 + 1;
    uVar21 = lVar20 + 1U & uVar19;
  } while (uVar18 <= uVar19);
  ppVar22 = (value_type_pointer)0x0;
LAB_00153179:
  if (ppVar22 == (value_type_pointer)0x0) {
    uStack_c0 = 0;
    if ((this->meta).nodeMap.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
        .size_ctrl.size <
        (this->meta).nodeMap.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&res,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                  *)this,(arrays_type *)this,uVar15,hash,&local_d9,(SyntaxNode **)&name);
      psVar1 = &(this->meta).nodeMap.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                ((locator *)&res,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                  *)this,hash,&local_d9,(SyntaxNode **)&name);
    }
    ppVar22 = (value_type_pointer)res.p;
  }
  (ppVar22->second).defaultNetType = (short)local_c8._0_4_;
  (ppVar22->second).unconnectedDrive = (short)((uint)local_c8._0_4_ >> 0x10);
  (ppVar22->second).cellDefine = local_d0._0_1_;
  (ppVar22->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_d8;
  (ppVar22->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_d4;
  return;
}

Assistant:

void handle(const ModuleDeclarationSyntax& syntax) {
        if (syntax.parent && syntax.parent->kind != SyntaxKind::CompilationUnit) {
            auto name = syntax.header->name.valueText();
            moduleDeclStack.back().emplace(name);
        }

        moduleDeclStack.emplace_back();
        visitDefault(syntax);
        moduleDeclStack.pop_back();

        // Needs to come after we visitDefault because visiting the first token
        // might update our preproc state.
        meta.nodeMap[&syntax] = {defaultNetType, unconnectedDrive, cellDefine, timeScale};
    }